

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O2

SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
absl::lts_20250127::strings_internal::
SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator++(SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this)

{
  pointer pcVar1;
  size_type sVar2;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  string_view text;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  if (this->state_ == kLastState) {
    this->state_ = kEndState;
  }
  else {
    pcVar1 = (this->splitter_->text_)._M_dataplus._M_p;
    sVar2 = (this->splitter_->text_)._M_string_length;
    sVar3._M_str = pcVar1;
    sVar3._M_len = sVar2;
    local_30._M_len = sVar2;
    local_30._M_str = pcVar1;
    sVar3 = ByChar::Find(&this->delimiter_,sVar3,this->pos_);
    if (sVar3._M_str == pcVar1 + sVar2) {
      this->state_ = kLastState;
    }
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_30,this->pos_,(long)sVar3._M_str - (long)(pcVar1 + this->pos_));
    (this->curr_)._M_len = bVar4._M_len;
    (this->curr_)._M_str = bVar4._M_str;
    this->pos_ = this->pos_ + sVar3._M_len + bVar4._M_len;
  }
  return this;
}

Assistant:

SplitIterator& operator++() {
    do {
      if (state_ == kLastState) {
        state_ = kEndState;
        return *this;
      }
      const absl::string_view text = splitter_->text();
      const absl::string_view d = delimiter_.Find(text, pos_);
      if (d.data() == text.data() + text.size()) state_ = kLastState;
      curr_ = text.substr(pos_,
                          static_cast<size_t>(d.data() - (text.data() + pos_)));
      pos_ += curr_.size() + d.size();
    } while (!predicate_(curr_));
    return *this;
  }